

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseStart
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *in_R8;
  undefined1 local_38 [8];
  string counts;
  TestCase *test_case_local;
  PrettyUnitTestResultPrinter *this_local;
  
  counts.field_2._8_8_ = test_case;
  uVar1 = TestCase::test_to_run_count(test_case);
  FormatCountableNoun_abi_cxx11_((string *)local_38,(testing *)(ulong)uVar1,0x1de1d3,"tests",in_R8);
  ColoredPrintf(COLOR_GREEN,"[----------] ");
  uVar2 = std::__cxx11::string::c_str();
  pcVar3 = TestCase::name((TestCase *)counts.field_2._8_8_);
  printf("%s from %s",uVar2,pcVar3);
  pcVar3 = TestCase::type_param((TestCase *)counts.field_2._8_8_);
  if (pcVar3 == (char *)0x0) {
    printf("\n");
  }
  else {
    pcVar3 = TestCase::type_param((TestCase *)counts.field_2._8_8_);
    printf(", where %s = %s\n","TypeParam",pcVar3);
  }
  fflush(_stdout);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseStart(const TestCase& test_case) {
  const std::string counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(COLOR_GREEN, "[----------] ");
  printf("%s from %s", counts.c_str(), test_case.name());
  if (test_case.type_param() == NULL) {
    printf("\n");
  } else {
    printf(", where %s = %s\n", kTypeParamLabel, test_case.type_param());
  }
  fflush(stdout);
}